

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLocusTanFixedRadiusArc.cpp
# Opt level: O1

bool ParseLocusTanFixedRadiusArc(string *sLine1,string *sLine2,string *sLine3)

{
  pointer pcVar1;
  size_type sVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  size_type sVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  string sTestId;
  int arcDirection;
  string sPtIntLon;
  string sPtIntLat;
  string sTanPt2Lon;
  string sTanPt2Lat;
  string sTanPt1Lon;
  string sTanPt1Lat;
  LLPoint intersection2;
  LLPoint intersection1;
  string sArcDirection;
  double local_720;
  string sLocus2EndLong;
  string sLocus2EndLat;
  string sLocus2StartLong;
  string sLocus2StartLat;
  string sLocus2GeoEndLong;
  string sLocus2GeoEndLat;
  string sLocus2GeoStartLong;
  string sLocus2GeoStartLat;
  string sLocus1EndLong;
  string sLocus1EndLat;
  string sLocus1StartLong;
  string sLocus1StartLat;
  string sLocus1GeoEndLong;
  string sLocus1GeoEndLat;
  string sLocus1GeoStartLong;
  string sLocus1GeoStartLat;
  string sArcRadius;
  string sLocus2EndDist;
  string sLocus2StartDist;
  string sLocus1EndDist;
  string sLocus1StartDist;
  Locus locus1;
  LLPoint arcCenter;
  string local_408;
  string sArcCenterLon;
  string sArcCenterLat;
  Locus locus2;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string sCenterLon;
  string sCenterLat;
  
  sLocus1GeoStartLat._M_dataplus._M_p = (pointer)&sLocus1GeoStartLat.field_2;
  sLocus1GeoStartLat._M_string_length = 0;
  sLocus1GeoStartLat.field_2._M_local_buf[0] = '\0';
  sLocus1GeoStartLong._M_dataplus._M_p = (pointer)&sLocus1GeoStartLong.field_2;
  sLocus1GeoStartLong._M_string_length = 0;
  sLocus1GeoStartLong.field_2._M_local_buf[0] = '\0';
  sLocus1GeoEndLat._M_dataplus._M_p = (pointer)&sLocus1GeoEndLat.field_2;
  sLocus1GeoEndLat._M_string_length = 0;
  sLocus1GeoEndLat.field_2._M_local_buf[0] = '\0';
  sLocus1GeoEndLong._M_dataplus._M_p = (pointer)&sLocus1GeoEndLong.field_2;
  sLocus1GeoEndLong._M_string_length = 0;
  sLocus1GeoEndLong.field_2._M_local_buf[0] = '\0';
  sLocus1StartLat._M_dataplus._M_p = (pointer)&sLocus1StartLat.field_2;
  sLocus1StartLat._M_string_length = 0;
  sLocus1StartLat.field_2._M_local_buf[0] = '\0';
  sLocus1StartLong._M_dataplus._M_p = (pointer)&sLocus1StartLong.field_2;
  sLocus1StartLong._M_string_length = 0;
  sLocus1StartLong.field_2._M_local_buf[0] = '\0';
  sLocus1EndLat._M_dataplus._M_p = (pointer)&sLocus1EndLat.field_2;
  sLocus1EndLat._M_string_length = 0;
  sLocus1EndLat.field_2._M_local_buf[0] = '\0';
  sLocus1EndLong._M_dataplus._M_p = (pointer)&sLocus1EndLong.field_2;
  sLocus1EndLong._M_string_length = 0;
  sLocus1EndLong.field_2._M_local_buf[0] = '\0';
  sLocus1StartDist._M_dataplus._M_p = (pointer)&sLocus1StartDist.field_2;
  sLocus1StartDist._M_string_length = 0;
  sLocus1StartDist.field_2._M_local_buf[0] = '\0';
  sLocus1EndDist._M_dataplus._M_p = (pointer)&sLocus1EndDist.field_2;
  sLocus1EndDist._M_string_length = 0;
  sLocus1EndDist.field_2._M_local_buf[0] = '\0';
  sLocus2GeoStartLat._M_dataplus._M_p = (pointer)&sLocus2GeoStartLat.field_2;
  sLocus2GeoStartLat._M_string_length = 0;
  sLocus2GeoStartLat.field_2._M_local_buf[0] = '\0';
  sLocus2GeoStartLong._M_dataplus._M_p = (pointer)&sLocus2GeoStartLong.field_2;
  sLocus2GeoStartLong._M_string_length = 0;
  sLocus2GeoStartLong.field_2._M_local_buf[0] = '\0';
  sLocus2GeoEndLat._M_dataplus._M_p = (pointer)&sLocus2GeoEndLat.field_2;
  sLocus2GeoEndLat._M_string_length = 0;
  sLocus2GeoEndLat.field_2._M_local_buf[0] = '\0';
  sLocus2GeoEndLong._M_dataplus._M_p = (pointer)&sLocus2GeoEndLong.field_2;
  sLocus2GeoEndLong._M_string_length = 0;
  sLocus2GeoEndLong.field_2._M_local_buf[0] = '\0';
  sLocus2StartLat._M_dataplus._M_p = (pointer)&sLocus2StartLat.field_2;
  sLocus2StartLat._M_string_length = 0;
  sLocus2StartLat.field_2._M_local_buf[0] = '\0';
  sLocus2StartLong._M_dataplus._M_p = (pointer)&sLocus2StartLong.field_2;
  sLocus2StartLong._M_string_length = 0;
  sLocus2StartLong.field_2._M_local_buf[0] = '\0';
  sLocus2EndLat._M_dataplus._M_p = (pointer)&sLocus2EndLat.field_2;
  sLocus2EndLat._M_string_length = 0;
  sLocus2EndLat.field_2._M_local_buf[0] = '\0';
  sLocus2EndLong._M_dataplus._M_p = (pointer)&sLocus2EndLong.field_2;
  sLocus2EndLong._M_string_length = 0;
  sLocus2EndLong.field_2._M_local_buf[0] = '\0';
  sLocus2StartDist._M_dataplus._M_p = (pointer)&sLocus2StartDist.field_2;
  sLocus2StartDist._M_string_length = 0;
  sLocus2StartDist.field_2._M_local_buf[0] = '\0';
  sLocus2EndDist._M_dataplus._M_p = (pointer)&sLocus2EndDist.field_2;
  sLocus2EndDist._M_string_length = 0;
  sLocus2EndDist.field_2._M_local_buf[0] = '\0';
  sArcRadius._M_dataplus._M_p = (pointer)&sArcRadius.field_2;
  sArcRadius._M_string_length = 0;
  sArcRadius.field_2._M_local_buf[0] = '\0';
  sArcDirection._M_dataplus._M_p = (pointer)&sArcDirection.field_2;
  sArcDirection._M_string_length = 0;
  sArcDirection.field_2._M_local_buf[0] = '\0';
  sArcCenterLat._M_dataplus._M_p = (pointer)&sArcCenterLat.field_2;
  sArcCenterLat._M_string_length = 0;
  sArcCenterLat.field_2._M_local_buf[0] = '\0';
  sArcCenterLon._M_dataplus._M_p = (pointer)&sArcCenterLon.field_2;
  sArcCenterLon._M_string_length = 0;
  sArcCenterLon.field_2._M_local_buf[0] = '\0';
  sTanPt1Lat._M_dataplus._M_p = (pointer)&sTanPt1Lat.field_2;
  sTanPt1Lat._M_string_length = 0;
  sTanPt1Lat.field_2._M_local_buf[0] = '\0';
  sTanPt1Lon._M_dataplus._M_p = (pointer)&sTanPt1Lon.field_2;
  sTanPt1Lon._M_string_length = 0;
  sTanPt1Lon.field_2._M_local_buf[0] = '\0';
  sTanPt2Lat._M_dataplus._M_p = (pointer)&sTanPt2Lat.field_2;
  sTanPt2Lat._M_string_length = 0;
  sTanPt2Lat.field_2._M_local_buf[0] = '\0';
  sTanPt2Lon._M_dataplus._M_p = (pointer)&sTanPt2Lon.field_2;
  sTanPt2Lon._M_string_length = 0;
  sTanPt2Lon.field_2._M_local_buf[0] = '\0';
  sTestId._M_dataplus._M_p = (pointer)&sTestId.field_2;
  sTestId._M_string_length = 0;
  sTestId.field_2._M_local_buf[0] = '\0';
  pcVar1 = (sLine1->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + sLine1->_M_string_length);
  bVar4 = ParseLocusTanFixedRadiusArc1
                    (&local_90,&sTestId,&sLocus1GeoStartLat,&sLocus1GeoStartLong,&sLocus1GeoEndLat,
                     &sLocus1GeoEndLong,&sLocus1StartLat,&sLocus1StartLong,&sLocus1EndLat,
                     &sLocus1EndLong,&sLocus1StartDist,&sLocus1EndDist);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (bVar4) {
    pcVar1 = (sLine2->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar1,pcVar1 + sLine2->_M_string_length);
    bVar4 = ParseLocusTanFixedRadiusArc2
                      (&local_b0,&sLocus2GeoStartLat,&sLocus2GeoStartLong,&sLocus2GeoEndLat,
                       &sLocus2GeoEndLong,&sLocus2StartLat,&sLocus2StartLong,&sLocus2EndLat,
                       &sLocus2EndLong,&sLocus2StartDist,&sLocus2EndDist,&sArcRadius);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if (bVar4) {
      pcVar1 = (sLine3->_M_dataplus)._M_p;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar1,pcVar1 + sLine3->_M_string_length);
      bVar4 = ParseLocusTanFixedRadiusArc3
                        (&local_d0,&sArcDirection,&sArcCenterLat,&sArcCenterLon,&sTanPt1Lat,
                         &sTanPt1Lon,&sTanPt2Lat,&sTanPt2Lon);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      bVar8 = false;
      if (!bVar4) goto LAB_0014a22b;
      locus1.lineType = 0;
      locus1.startDist = 0.0;
      locus1.endDist = 0.0;
      locus1.locusEnd.latitude = 0.0;
      locus1.locusEnd.longitude = 0.0;
      locus1.locusStart.latitude = 0.0;
      locus1.locusStart.longitude = 0.0;
      locus1.geoEnd.latitude = 0.0;
      locus1.geoEnd.longitude = 0.0;
      locus1.geoStart.latitude = 0.0;
      locus1.geoStart.longitude = 0.0;
      locus2.lineType = 0;
      locus2.startDist = 0.0;
      locus2.endDist = 0.0;
      locus2.locusEnd.latitude = 0.0;
      locus2.locusEnd.longitude = 0.0;
      locus2.locusStart.latitude = 0.0;
      locus2.locusStart.longitude = 0.0;
      locus2.geoEnd.latitude = 0.0;
      locus2.geoEnd.longitude = 0.0;
      locus2.geoStart.latitude = 0.0;
      locus2.geoStart.longitude = 0.0;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,sLocus1GeoStartLat._M_dataplus._M_p,
                 sLocus1GeoStartLat._M_dataplus._M_p + sLocus1GeoStartLat._M_string_length);
      dVar9 = ParseLatitude(&local_f0);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,sLocus1GeoStartLong._M_dataplus._M_p,
                 sLocus1GeoStartLong._M_dataplus._M_p + sLocus1GeoStartLong._M_string_length);
      dVar10 = ParseLongitude(&local_110);
      locus1.geoStart.latitude = dVar9 * 0.017453292519943295;
      locus1.geoStart.longitude = dVar10 * 0.017453292519943295;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,sLocus1GeoEndLat._M_dataplus._M_p,
                 sLocus1GeoEndLat._M_dataplus._M_p + sLocus1GeoEndLat._M_string_length);
      dVar9 = ParseLatitude(&local_130);
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_150,sLocus1GeoEndLong._M_dataplus._M_p,
                 sLocus1GeoEndLong._M_dataplus._M_p + sLocus1GeoEndLong._M_string_length);
      dVar10 = ParseLongitude(&local_150);
      locus1.geoEnd.latitude = dVar9 * 0.017453292519943295;
      locus1.geoEnd.longitude = dVar10 * 0.017453292519943295;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,sLocus1StartLat._M_dataplus._M_p,
                 sLocus1StartLat._M_dataplus._M_p + sLocus1StartLat._M_string_length);
      dVar9 = ParseLatitude(&local_170);
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,sLocus1StartLong._M_dataplus._M_p,
                 sLocus1StartLong._M_dataplus._M_p + sLocus1StartLong._M_string_length);
      dVar10 = ParseLongitude(&local_190);
      locus1.locusStart.latitude = dVar9 * 0.017453292519943295;
      locus1.locusStart.longitude = dVar10 * 0.017453292519943295;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b0,sLocus1EndLat._M_dataplus._M_p,
                 sLocus1EndLat._M_dataplus._M_p + sLocus1EndLat._M_string_length);
      dVar9 = ParseLatitude(&local_1b0);
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d0,sLocus1EndLong._M_dataplus._M_p,
                 sLocus1EndLong._M_dataplus._M_p + sLocus1EndLong._M_string_length);
      dVar10 = ParseLongitude(&local_1d0);
      locus1.locusEnd.latitude = dVar9 * 0.017453292519943295;
      locus1.locusEnd.longitude = dVar10 * 0.017453292519943295;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
      dVar9 = atof(sLocus1StartDist._M_dataplus._M_p);
      locus1.startDist = dVar9 * 1852.0;
      dVar9 = atof(sLocus1EndDist._M_dataplus._M_p);
      locus1.endDist = dVar9 * 1852.0;
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f0,sLocus2GeoStartLat._M_dataplus._M_p,
                 sLocus2GeoStartLat._M_dataplus._M_p + sLocus2GeoStartLat._M_string_length);
      dVar9 = ParseLatitude(&local_1f0);
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,sLocus2GeoStartLong._M_dataplus._M_p,
                 sLocus2GeoStartLong._M_dataplus._M_p + sLocus2GeoStartLong._M_string_length);
      dVar10 = ParseLongitude(&local_210);
      locus2.geoStart.latitude = dVar9 * 0.017453292519943295;
      locus2.geoStart.longitude = dVar10 * 0.017453292519943295;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,sLocus2GeoEndLat._M_dataplus._M_p,
                 sLocus2GeoEndLat._M_dataplus._M_p + sLocus2GeoEndLat._M_string_length);
      dVar9 = ParseLatitude(&local_230);
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,sLocus2GeoEndLong._M_dataplus._M_p,
                 sLocus2GeoEndLong._M_dataplus._M_p + sLocus2GeoEndLong._M_string_length);
      dVar10 = ParseLongitude(&local_250);
      locus2.geoEnd.latitude = dVar9 * 0.017453292519943295;
      locus2.geoEnd.longitude = dVar10 * 0.017453292519943295;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_270,sLocus2StartLat._M_dataplus._M_p,
                 sLocus2StartLat._M_dataplus._M_p + sLocus2StartLat._M_string_length);
      dVar9 = ParseLatitude(&local_270);
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_290,sLocus2StartLong._M_dataplus._M_p,
                 sLocus2StartLong._M_dataplus._M_p + sLocus2StartLong._M_string_length);
      dVar10 = ParseLongitude(&local_290);
      locus2.locusStart.latitude = dVar9 * 0.017453292519943295;
      locus2.locusStart.longitude = dVar10 * 0.017453292519943295;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b0,sLocus2EndLat._M_dataplus._M_p,
                 sLocus2EndLat._M_dataplus._M_p + sLocus2EndLat._M_string_length);
      dVar9 = ParseLatitude(&local_2b0);
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2d0,sLocus2EndLong._M_dataplus._M_p,
                 sLocus2EndLong._M_dataplus._M_p + sLocus2EndLong._M_string_length);
      dVar10 = ParseLongitude(&local_2d0);
      locus2.locusEnd.latitude = dVar9 * 0.017453292519943295;
      locus2.locusEnd.longitude = dVar10 * 0.017453292519943295;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p);
      }
      dVar9 = atof(sLocus2StartDist._M_dataplus._M_p);
      locus2.startDist = dVar9 * 1852.0;
      dVar9 = atof(sLocus2EndDist._M_dataplus._M_p);
      locus2.endDist = dVar9 * 1852.0;
      dVar9 = atof(sArcRadius._M_dataplus._M_p);
      intersection1.latitude = 0.0;
      intersection1.longitude = 0.0;
      intersection2.latitude = 0.0;
      intersection2.longitude = 0.0;
      arcCenter.latitude = 0.0;
      arcCenter.longitude = 0.0;
      iVar5 = GeoCalcs::LocusTanFixedRadiusArc
                        (&locus1,&locus2,dVar9 * 1852.0,&arcDirection,&arcCenter,&intersection1,
                         &intersection2,1e-09,5e-16);
      if (iVar5 != 0) {
        sCenterLon._M_dataplus._M_p = (pointer)(arcCenter.latitude * 57.29577951308232);
        ConvertLatitudeDdToDms_abi_cxx11_(&sCenterLat,(double *)&sCenterLon);
        sPtIntLat._M_dataplus._M_p = (pointer)(arcCenter.longitude * 57.29577951308232);
        ConvertLongitudeDdToDms_abi_cxx11_(&sCenterLon,(double *)&sPtIntLat);
        sPtIntLon._M_dataplus._M_p = (pointer)(intersection1.latitude * 57.29577951308232);
        ConvertLatitudeDdToDms_abi_cxx11_(&sPtIntLat,(double *)&sPtIntLon);
        local_408._M_dataplus._M_p = (pointer)(intersection1.longitude * 57.29577951308232);
        ConvertLongitudeDdToDms_abi_cxx11_(&sPtIntLon,(double *)&local_408);
        iVar5 = atoi(sArcDirection._M_dataplus._M_p);
        bVar4 = true;
        bVar8 = iVar5 == arcDirection;
        if (!bVar8) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,sTestId._M_dataplus._M_p,
                              sTestId._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," failed: Expected Arc direction: ",0x21);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,sArcDirection._M_dataplus._M_p,sArcDirection._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  calced: ",10);
          std::ostream::operator<<(poVar6,arcDirection);
        }
        sVar3 = sTanPt1Lat._M_string_length;
        sVar2 = sPtIntLat._M_string_length;
        sVar7 = sPtIntLat._M_string_length;
        if (sTanPt1Lat._M_string_length < sPtIntLat._M_string_length) {
          sVar7 = sTanPt1Lat._M_string_length;
        }
        if (sVar7 != 0) {
          iVar5 = bcmp(sPtIntLat._M_dataplus._M_p,sTanPt1Lat._M_dataplus._M_p,sVar7);
          bVar4 = iVar5 == 0;
        }
        if (!(bool)(bVar4 & sVar2 == sVar3)) {
          local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2f0,sTanPt1Lat._M_dataplus._M_p,
                     sTanPt1Lat._M_dataplus._M_p + sVar3);
          dVar9 = ParseLatitude(&local_2f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p);
          }
          dVar11 = ABS(dVar9 * 0.017453292519943295);
          dVar10 = ABS(intersection1.latitude);
          if (dVar11 <= ABS(intersection1.latitude)) {
            dVar10 = dVar11;
          }
          if (ABS(dVar9 * 0.017453292519943295 - intersection1.latitude) <= dVar10 * 1e-10) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,sTestId._M_dataplus._M_p,
                                sTestId._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6," within rounding tolerance of 1e-10: Tan Pt1 Latitude: ",0x37);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,sTanPt1Lat._M_dataplus._M_p,sTanPt1Lat._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," calced: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,sPtIntLat._M_dataplus._M_p,sPtIntLat._M_string_length);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,sTestId._M_dataplus._M_p,
                                sTestId._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6," failed: Expected Tan Pt1 latitude: ",0x24);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,sTanPt1Lat._M_dataplus._M_p,sTanPt1Lat._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  calced: ",10);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,sPtIntLat._M_dataplus._M_p,sPtIntLat._M_string_length);
            bVar8 = false;
          }
        }
        sVar3 = sTanPt1Lon._M_string_length;
        sVar2 = sPtIntLon._M_string_length;
        sVar7 = sPtIntLon._M_string_length;
        if (sTanPt1Lon._M_string_length < sPtIntLon._M_string_length) {
          sVar7 = sTanPt1Lon._M_string_length;
        }
        if (sVar7 == 0) {
          bVar4 = true;
        }
        else {
          iVar5 = bcmp(sPtIntLon._M_dataplus._M_p,sTanPt1Lon._M_dataplus._M_p,sVar7);
          bVar4 = iVar5 == 0;
        }
        if (!(bool)(bVar4 & sVar2 == sVar3)) {
          local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_310,sTanPt1Lon._M_dataplus._M_p,
                     sTanPt1Lon._M_dataplus._M_p + sVar3);
          dVar9 = ParseLongitude(&local_310);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p != &local_310.field_2) {
            operator_delete(local_310._M_dataplus._M_p);
          }
          dVar11 = ABS(dVar9 * 0.017453292519943295);
          dVar10 = ABS(intersection1.longitude);
          if (dVar11 <= ABS(intersection1.longitude)) {
            dVar10 = dVar11;
          }
          if (ABS(dVar9 * 0.017453292519943295 - intersection1.longitude) <= dVar10 * 1e-10) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,sTestId._M_dataplus._M_p,
                                sTestId._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6," within rounding tolerance of 1e-10: Tan Pt1 Longitude: ",0x38);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,sTanPt1Lon._M_dataplus._M_p,sTanPt1Lon._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," calced: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,sPtIntLon._M_dataplus._M_p,sPtIntLon._M_string_length);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,sTestId._M_dataplus._M_p,
                                sTestId._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6," failed: Expected Tan Pt1 longitude: ",0x25);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,sTanPt1Lon._M_dataplus._M_p,sTanPt1Lon._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  calced: ",10);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,sPtIntLon._M_dataplus._M_p,sPtIntLon._M_string_length);
            bVar8 = false;
          }
        }
        local_720 = intersection2.latitude * 57.29577951308232;
        ConvertLatitudeDdToDms_abi_cxx11_(&local_408,&local_720);
        std::__cxx11::string::operator=((string *)&sPtIntLat,(string *)&local_408);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p);
        }
        local_720 = intersection2.longitude * 57.29577951308232;
        ConvertLongitudeDdToDms_abi_cxx11_(&local_408,&local_720);
        std::__cxx11::string::operator=((string *)&sPtIntLon,(string *)&local_408);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p);
        }
        sVar3 = sTanPt2Lat._M_string_length;
        sVar2 = sPtIntLat._M_string_length;
        sVar7 = sPtIntLat._M_string_length;
        if (sTanPt2Lat._M_string_length < sPtIntLat._M_string_length) {
          sVar7 = sTanPt2Lat._M_string_length;
        }
        if (sVar7 == 0) {
          bVar4 = true;
        }
        else {
          iVar5 = bcmp(sPtIntLat._M_dataplus._M_p,sTanPt2Lat._M_dataplus._M_p,sVar7);
          bVar4 = iVar5 == 0;
        }
        if (!(bool)(bVar4 & sVar2 == sVar3)) {
          local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_330,sTanPt2Lat._M_dataplus._M_p,
                     sTanPt2Lat._M_dataplus._M_p + sVar3);
          dVar9 = ParseLatitude(&local_330);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_dataplus._M_p != &local_330.field_2) {
            operator_delete(local_330._M_dataplus._M_p);
          }
          dVar11 = ABS(dVar9 * 0.017453292519943295);
          dVar10 = ABS(intersection2.latitude);
          if (dVar11 <= ABS(intersection2.latitude)) {
            dVar10 = dVar11;
          }
          if (ABS(dVar9 * 0.017453292519943295 - intersection2.latitude) <= dVar10 * 1e-10) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,sTestId._M_dataplus._M_p,
                                sTestId._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6," within rounding tolerance of 1e-10: Tan Pt2 Latitude: ",0x37);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,sTanPt2Lat._M_dataplus._M_p,sTanPt2Lat._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," calced: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,sPtIntLat._M_dataplus._M_p,sPtIntLat._M_string_length);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,sTestId._M_dataplus._M_p,
                                sTestId._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6," failed: Expected Tan Pt2 latitude: ",0x24);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,sTanPt2Lat._M_dataplus._M_p,sTanPt2Lat._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  calced: ",10);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,sPtIntLat._M_dataplus._M_p,sPtIntLat._M_string_length);
            bVar8 = false;
          }
        }
        sVar3 = sTanPt2Lon._M_string_length;
        sVar2 = sPtIntLon._M_string_length;
        sVar7 = sPtIntLon._M_string_length;
        if (sTanPt2Lon._M_string_length < sPtIntLon._M_string_length) {
          sVar7 = sTanPt2Lon._M_string_length;
        }
        if (sVar7 == 0) {
          bVar4 = true;
        }
        else {
          iVar5 = bcmp(sPtIntLon._M_dataplus._M_p,sTanPt2Lon._M_dataplus._M_p,sVar7);
          bVar4 = iVar5 == 0;
        }
        if (!(bool)(bVar4 & sVar2 == sVar3)) {
          local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_350,sTanPt2Lon._M_dataplus._M_p,
                     sTanPt2Lon._M_dataplus._M_p + sVar3);
          dVar9 = ParseLongitude(&local_350);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_350._M_dataplus._M_p != &local_350.field_2) {
            operator_delete(local_350._M_dataplus._M_p);
          }
          dVar11 = ABS(dVar9 * 0.017453292519943295);
          dVar10 = ABS(intersection2.longitude);
          if (dVar11 <= ABS(intersection2.longitude)) {
            dVar10 = dVar11;
          }
          if (ABS(dVar9 * 0.017453292519943295 - intersection2.longitude) <= dVar10 * 1e-10) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,sTestId._M_dataplus._M_p,
                                sTestId._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6," within rounding tolerance of 1e-10: Tan Pt2 Longitude: ",0x38);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,sTanPt2Lon._M_dataplus._M_p,sTanPt2Lon._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," calced: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,sPtIntLon._M_dataplus._M_p,sPtIntLon._M_string_length);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,sTestId._M_dataplus._M_p,
                                sTestId._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6," failed: Expected Tan Pt2 longitude: ",0x25);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,sTanPt2Lon._M_dataplus._M_p,sTanPt2Lon._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  calced: ",10);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,sPtIntLon._M_dataplus._M_p,sPtIntLon._M_string_length);
            bVar8 = false;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sPtIntLon._M_dataplus._M_p != &sPtIntLon.field_2) {
          operator_delete(sPtIntLon._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sPtIntLat._M_dataplus._M_p != &sPtIntLat.field_2) {
          operator_delete(sPtIntLat._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sCenterLon._M_dataplus._M_p != &sCenterLon.field_2) {
          operator_delete(sCenterLon._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sCenterLat._M_dataplus._M_p != &sCenterLat.field_2) {
          operator_delete(sCenterLat._M_dataplus._M_p);
        }
        goto LAB_0014a22b;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,sTestId._M_dataplus._M_p,sTestId._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"failed: Expected solution, found none.",0x26);
    }
  }
  bVar8 = false;
LAB_0014a22b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sTestId._M_dataplus._M_p != &sTestId.field_2) {
    operator_delete(sTestId._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sTanPt2Lon._M_dataplus._M_p != &sTanPt2Lon.field_2) {
    operator_delete(sTanPt2Lon._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sTanPt2Lat._M_dataplus._M_p != &sTanPt2Lat.field_2) {
    operator_delete(sTanPt2Lat._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sTanPt1Lon._M_dataplus._M_p != &sTanPt1Lon.field_2) {
    operator_delete(sTanPt1Lon._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sTanPt1Lat._M_dataplus._M_p != &sTanPt1Lat.field_2) {
    operator_delete(sTanPt1Lat._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sArcCenterLon._M_dataplus._M_p != &sArcCenterLon.field_2) {
    operator_delete(sArcCenterLon._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sArcCenterLat._M_dataplus._M_p != &sArcCenterLat.field_2) {
    operator_delete(sArcCenterLat._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sArcDirection._M_dataplus._M_p != &sArcDirection.field_2) {
    operator_delete(sArcDirection._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sArcRadius._M_dataplus._M_p != &sArcRadius.field_2) {
    operator_delete(sArcRadius._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus2EndDist._M_dataplus._M_p != &sLocus2EndDist.field_2) {
    operator_delete(sLocus2EndDist._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus2StartDist._M_dataplus._M_p != &sLocus2StartDist.field_2) {
    operator_delete(sLocus2StartDist._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus2EndLong._M_dataplus._M_p != &sLocus2EndLong.field_2) {
    operator_delete(sLocus2EndLong._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus2EndLat._M_dataplus._M_p != &sLocus2EndLat.field_2) {
    operator_delete(sLocus2EndLat._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus2StartLong._M_dataplus._M_p != &sLocus2StartLong.field_2) {
    operator_delete(sLocus2StartLong._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus2StartLat._M_dataplus._M_p != &sLocus2StartLat.field_2) {
    operator_delete(sLocus2StartLat._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus2GeoEndLong._M_dataplus._M_p != &sLocus2GeoEndLong.field_2) {
    operator_delete(sLocus2GeoEndLong._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus2GeoEndLat._M_dataplus._M_p != &sLocus2GeoEndLat.field_2) {
    operator_delete(sLocus2GeoEndLat._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus2GeoStartLong._M_dataplus._M_p != &sLocus2GeoStartLong.field_2) {
    operator_delete(sLocus2GeoStartLong._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus2GeoStartLat._M_dataplus._M_p != &sLocus2GeoStartLat.field_2) {
    operator_delete(sLocus2GeoStartLat._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus1EndDist._M_dataplus._M_p != &sLocus1EndDist.field_2) {
    operator_delete(sLocus1EndDist._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus1StartDist._M_dataplus._M_p != &sLocus1StartDist.field_2) {
    operator_delete(sLocus1StartDist._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus1EndLong._M_dataplus._M_p != &sLocus1EndLong.field_2) {
    operator_delete(sLocus1EndLong._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus1EndLat._M_dataplus._M_p != &sLocus1EndLat.field_2) {
    operator_delete(sLocus1EndLat._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus1StartLong._M_dataplus._M_p != &sLocus1StartLong.field_2) {
    operator_delete(sLocus1StartLong._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus1StartLat._M_dataplus._M_p != &sLocus1StartLat.field_2) {
    operator_delete(sLocus1StartLat._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus1GeoEndLong._M_dataplus._M_p != &sLocus1GeoEndLong.field_2) {
    operator_delete(sLocus1GeoEndLong._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus1GeoEndLat._M_dataplus._M_p != &sLocus1GeoEndLat.field_2) {
    operator_delete(sLocus1GeoEndLat._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus1GeoStartLong._M_dataplus._M_p != &sLocus1GeoStartLong.field_2) {
    operator_delete(sLocus1GeoStartLong._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sLocus1GeoStartLat._M_dataplus._M_p != &sLocus1GeoStartLat.field_2) {
    operator_delete(sLocus1GeoStartLat._M_dataplus._M_p);
  }
  return bVar8;
}

Assistant:

bool ParseLocusTanFixedRadiusArc(string sLine1, string sLine2, string sLine3)
{
    bool bPassed = true;

    string sLocus1GeoStartLat, sLocus1GeoStartLong, sLocus1GeoEndLat, sLocus1GeoEndLong;
    string sLocus1StartLat, sLocus1StartLong, sLocus1EndLat, sLocus1EndLong;
    string sLocus1StartDist, sLocus1EndDist;

    string sLocus2GeoStartLat, sLocus2GeoStartLong, sLocus2GeoEndLat, sLocus2GeoEndLong;
    string sLocus2StartLat, sLocus2StartLong, sLocus2EndLat, sLocus2EndLong;
    string sLocus2StartDist, sLocus2EndDist;
    string sArcRadius;

    string sArcDirection, sArcCenterLat, sArcCenterLon, sTanPt1Lat, sTanPt1Lon, sTanPt2Lat, sTanPt2Lon;

    string sTestId;

    if (!ParseLocusTanFixedRadiusArc1(sLine1, sTestId, sLocus1GeoStartLat, sLocus1GeoStartLong, sLocus1GeoEndLat,
                                      sLocus1GeoEndLong,
                                      sLocus1StartLat, sLocus1StartLong, sLocus1EndLat, sLocus1EndLong,
                                      sLocus1StartDist, sLocus1EndDist))
        return false;

    if (!ParseLocusTanFixedRadiusArc2(sLine2, sLocus2GeoStartLat, sLocus2GeoStartLong, sLocus2GeoEndLat,
                                      sLocus2GeoEndLong,
                                      sLocus2StartLat, sLocus2StartLong, sLocus2EndLat, sLocus2EndLong,
                                      sLocus2StartDist, sLocus2EndDist, sArcRadius))
        return false;

    if (!ParseLocusTanFixedRadiusArc3(sLine3, sArcDirection, sArcCenterLat, sArcCenterLon, sTanPt1Lat, sTanPt1Lon,
                                      sTanPt2Lat, sTanPt2Lon))
        return false;

    Locus locus1, locus2;
    locus1.geoStart.Set(Deg2Rad(ParseLatitude(sLocus1GeoStartLat)), Deg2Rad(ParseLongitude(sLocus1GeoStartLong)));
    locus1.geoEnd.Set(Deg2Rad(ParseLatitude(sLocus1GeoEndLat)), Deg2Rad(ParseLongitude(sLocus1GeoEndLong)));
    locus1.locusStart.Set(Deg2Rad(ParseLatitude(sLocus1StartLat)), Deg2Rad(ParseLongitude(sLocus1StartLong)));
    locus1.locusEnd.Set(Deg2Rad(ParseLatitude(sLocus1EndLat)), Deg2Rad(ParseLongitude(sLocus1EndLong)));
    locus1.startDist = NmToMeters(atof(sLocus1StartDist.c_str()));
    locus1.endDist = NmToMeters(atof(sLocus1EndDist.c_str()));

    locus2.geoStart.Set(Deg2Rad(ParseLatitude(sLocus2GeoStartLat)), Deg2Rad(ParseLongitude(sLocus2GeoStartLong)));
    locus2.geoEnd.Set(Deg2Rad(ParseLatitude(sLocus2GeoEndLat)), Deg2Rad(ParseLongitude(sLocus2GeoEndLong)));
    locus2.locusStart.Set(Deg2Rad(ParseLatitude(sLocus2StartLat)), Deg2Rad(ParseLongitude(sLocus2StartLong)));
    locus2.locusEnd.Set(Deg2Rad(ParseLatitude(sLocus2EndLat)), Deg2Rad(ParseLongitude(sLocus2EndLong)));
    locus2.startDist = NmToMeters(atof(sLocus2StartDist.c_str()));
    locus2.endDist = NmToMeters(atof(sLocus2EndDist.c_str()));

    double arcRadius = NmToMeters(atof(sArcRadius.c_str()));
    int arcDirection;
    LLPoint intersection1, intersection2;
    LLPoint arcCenter;
    int nVal = LocusTanFixedRadiusArc(locus1, locus2, arcRadius, arcDirection, arcCenter,
                                      intersection1, intersection2, kTol, kEps);

    if (nVal == 0)
    {
        cout << "\n" << sTestId << "failed: Expected solution, found none.";
        bPassed = false;

    }
    else
    {
        string sCenterLat = ConvertLatitudeDdToDms(Rad2Deg(arcCenter.latitude));
        string sCenterLon = ConvertLongitudeDdToDms(Rad2Deg(arcCenter.longitude));
        string sPtIntLat = ConvertLatitudeDdToDms(Rad2Deg(intersection1.latitude));
        string sPtIntLon = ConvertLongitudeDdToDms(Rad2Deg(intersection1.longitude));

        if (atoi(sArcDirection.c_str()) != arcDirection)
        {
            cout << "\n" << sTestId << " failed: Expected Arc direction: " << sArcDirection << "  calced: " <<
            arcDirection;
            bPassed = false;
        }

        if (sPtIntLat.compare(sTanPt1Lat) != 0)
        {
            double dLat = Deg2Rad(ParseLatitude(sTanPt1Lat));
            if (IsApprox(dLat, intersection1.latitude, 1e-10))
                cout << "\n" << sTestId << " within rounding tolerance of 1e-10: Tan Pt1 Latitude: " << sTanPt1Lat <<
                " calced: " << sPtIntLat;
            else
            {
                cout << "\n" << sTestId << " failed: Expected Tan Pt1 latitude: " << sTanPt1Lat << "  calced: " <<
                sPtIntLat;
                bPassed = false;
            }
        }
        if (sPtIntLon.compare(sTanPt1Lon) != 0)
        {
            double dLon = Deg2Rad(ParseLongitude(sTanPt1Lon));
            if (IsApprox(dLon, intersection1.longitude, 1e-10))
                cout << "\n" << sTestId << " within rounding tolerance of 1e-10: Tan Pt1 Longitude: " << sTanPt1Lon <<
                " calced: " << sPtIntLon;
            else
            {
                cout << "\n" << sTestId << " failed: Expected Tan Pt1 longitude: " << sTanPt1Lon << "  calced: " <<
                sPtIntLon;
                bPassed = false;
            }
        }

        sPtIntLat = ConvertLatitudeDdToDms(Rad2Deg(intersection2.latitude));
        sPtIntLon = ConvertLongitudeDdToDms(Rad2Deg(intersection2.longitude));

        if (sPtIntLat.compare(sTanPt2Lat) != 0)
        {
            double dLat = Deg2Rad(ParseLatitude(sTanPt2Lat));
            if (IsApprox(dLat, intersection2.latitude, 1e-10))
                cout << "\n" << sTestId << " within rounding tolerance of 1e-10: Tan Pt2 Latitude: " << sTanPt2Lat <<
                " calced: " << sPtIntLat;
            else
            {
                cout << "\n" << sTestId << " failed: Expected Tan Pt2 latitude: " << sTanPt2Lat << "  calced: " <<
                sPtIntLat;
                bPassed = false;
            }
        }
        if (sPtIntLon.compare(sTanPt2Lon) != 0)
        {
            double dLon = Deg2Rad(ParseLongitude(sTanPt2Lon));
            if (IsApprox(dLon, intersection2.longitude, 1e-10))
                cout << "\n" << sTestId << " within rounding tolerance of 1e-10: Tan Pt2 Longitude: " << sTanPt2Lon <<
                " calced: " << sPtIntLon;
            else
            {
                cout << "\n" << sTestId << " failed: Expected Tan Pt2 longitude: " << sTanPt2Lon << "  calced: " <<
                sPtIntLon;
                bPassed = false;
            }
        }

    }
    return bPassed;
}